

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void xmlParserWarning(void *ctx,char *msg,...)

{
  xmlParserInputPtr pxVar1;
  xmlGenericErrorFunc p_Var2;
  char in_AL;
  int iVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  char *pcVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar7;
  xmlParserInputPtr input;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  int iVar9;
  bool bVar10;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  xmlParserInputPtr local_120;
  va_list ap;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  int iVar8;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (ctx == (void *)0x0) {
    input = (xmlParserInputPtr)0x0;
    local_120 = (xmlParserInputPtr)0x0;
  }
  else {
    pxVar1 = *(xmlParserInputPtr *)((long)ctx + 0x38);
    if (pxVar1 == (xmlParserInputPtr)0x0) {
      input = (xmlParserInputPtr)0x0;
      local_120 = (xmlParserInputPtr)0x0;
    }
    else if ((pxVar1->filename == (char *)0x0) && (1 < (long)*(int *)((long)ctx + 0x40))) {
      local_120 = *(xmlParserInputPtr *)
                   (*(long *)((long)ctx + 0x48) + -0x10 + (long)*(int *)((long)ctx + 0x40) * 8);
      input = pxVar1;
    }
    else {
      input = (xmlParserInputPtr)0x0;
      local_120 = pxVar1;
    }
    xmlParserPrintFileInfo(local_120);
  }
  pp_Var4 = __xmlGenericError();
  p_Var2 = *pp_Var4;
  ppvVar5 = __xmlGenericErrorContext();
  __s = (char *)0x0;
  (*p_Var2)(*ppvVar5,"warning: ");
  pcVar6 = (char *)(*xmlMalloc)(0x96);
  if (pcVar6 != (char *)0x0) {
    iVar9 = -1;
    uVar7 = 0x96;
    do {
      __s = pcVar6;
      if (63999 < (int)uVar7) break;
      ap[0].reg_save_area = local_e8;
      ap[0].overflow_arg_area = &stack0x00000008;
      ap[0].gp_offset = 0x10;
      ap[0].fp_offset = 0x30;
      iVar3 = vsnprintf(__s,(ulong)uVar7,msg,ap);
      if ((iVar3 < (int)uVar7 && -1 < iVar3) && (bVar10 = iVar9 == iVar3, iVar9 = iVar3, bVar10))
      break;
      iVar8 = iVar3 + 1;
      if (iVar3 < 0) {
        iVar8 = 100;
      }
      uVar7 = iVar8 + uVar7;
      pcVar6 = (char *)(*xmlRealloc)(__s,(ulong)uVar7);
    } while (pcVar6 != (char *)0x0);
  }
  pp_Var4 = __xmlGenericError();
  p_Var2 = *pp_Var4;
  ppvVar5 = __xmlGenericErrorContext();
  (*p_Var2)(*ppvVar5,"%s",__s);
  if (__s != (char *)0x0) {
    (*xmlFree)(__s);
  }
  if (ctx != (void *)0x0) {
    xmlParserPrintFileContext(local_120);
    if (input != (xmlParserInputPtr)0x0) {
      xmlParserPrintFileInfo(input);
      pp_Var4 = __xmlGenericError();
      p_Var2 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar5,"\n");
      xmlParserPrintFileContext(input);
    }
  }
  return;
}

Assistant:

void XMLCDECL
xmlParserWarning(void *ctx, const char *msg, ...)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserInputPtr input = NULL;
    xmlParserInputPtr cur = NULL;
    char * str;

    if (ctxt != NULL) {
	input = ctxt->input;
	if ((input != NULL) && (input->filename == NULL) &&
	    (ctxt->inputNr > 1)) {
	    cur = input;
	    input = ctxt->inputTab[ctxt->inputNr - 2];
	}
	xmlParserPrintFileInfo(input);
    }

    xmlGenericError(xmlGenericErrorContext, "warning: ");
    XML_GET_VAR_STR(msg, str);
    xmlGenericError(xmlGenericErrorContext, "%s", str);
    if (str != NULL)
	xmlFree(str);

    if (ctxt != NULL) {
	xmlParserPrintFileContext(input);
	if (cur != NULL) {
	    xmlParserPrintFileInfo(cur);
	    xmlGenericError(xmlGenericErrorContext, "\n");
	    xmlParserPrintFileContext(cur);
	}
    }
}